

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSolverADMM.cpp
# Opt level: O3

void __thiscall chrono::ChSolverADMM::Solve(ChSolverADMM *this)

{
  code *UNRECOVERED_JUMPTABLE;
  ulong uVar1;
  undefined8 in_RSI;
  
  uVar1 = (ulong)(this->stepadjust_type == BALANCED_UNSCALED);
  UNRECOVERED_JUMPTABLE = *(code **)(*(long *)&this[-1].acceleration + 0x48 + uVar1 * 8);
  (*UNRECOVERED_JUMPTABLE)(&this[-1].acceleration,in_RSI,uVar1,UNRECOVERED_JUMPTABLE);
  return;
}

Assistant:

double ChSolverADMM::Solve(ChSystemDescriptor& sysd) {

    switch (this->acceleration) {
    case AdmmAcceleration::BASIC:
        return _SolveBasic(sysd);
    case AdmmAcceleration::NESTEROV:
        return _SolveFast(sysd);
    default: 
        return _SolveBasic(sysd);
    }
}